

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxy.cpp
# Opt level: O2

void __thiscall Shell::EqualityProxy::addLocalAxioms(EqualityProxy *this,UnitList **units)

{
  EqualityProxy EVar1;
  Literal *pLVar2;
  Clause *pCVar3;
  Stack<Kernel::Literal_*> local_38;
  
  local_38._cursor = (Literal **)0x0;
  local_38._end = (Literal **)0x0;
  local_38._capacity = 0;
  local_38._stack = (Literal **)0x0;
  pLVar2 = makeProxyLiteral(this,true,(TermList)0x5,(TermList)0x5,(TermList)0x1);
  Lib::Stack<Kernel::Literal_*>::push(&local_38,pLVar2);
  pCVar3 = createEqProxyAxiom(this,&local_38);
  Lib::List<Kernel::Unit_*>::push(&pCVar3->super_Unit,units);
  EVar1 = this->_opt;
  if (EVar1 - RS < 3) {
    local_38._cursor = local_38._stack;
    pLVar2 = makeProxyLiteral(this,false,(TermList)0x5,(TermList)0x9,(TermList)0x1);
    Lib::Stack<Kernel::Literal_*>::push(&local_38,pLVar2);
    pLVar2 = makeProxyLiteral(this,true,(TermList)0x9,(TermList)0x5,(TermList)0x1);
    Lib::Stack<Kernel::Literal_*>::push(&local_38,pLVar2);
    pCVar3 = createEqProxyAxiom(this,&local_38);
    Lib::List<Kernel::Unit_*>::push(&pCVar3->super_Unit,units);
    EVar1 = this->_opt;
  }
  if ((EVar1 & ~RS) == RST) {
    local_38._cursor = local_38._stack;
    pLVar2 = makeProxyLiteral(this,false,(TermList)0x5,(TermList)0x9,(TermList)0x1);
    Lib::Stack<Kernel::Literal_*>::push(&local_38,pLVar2);
    pLVar2 = makeProxyLiteral(this,false,(TermList)0x9,(TermList)0xd,(TermList)0x1);
    Lib::Stack<Kernel::Literal_*>::push(&local_38,pLVar2);
    pLVar2 = makeProxyLiteral(this,true,(TermList)0x5,(TermList)0xd,(TermList)0x1);
    Lib::Stack<Kernel::Literal_*>::push(&local_38,pLVar2);
    pCVar3 = createEqProxyAxiom(this,&local_38);
    Lib::List<Kernel::Unit_*>::push(&pCVar3->super_Unit,units);
  }
  Lib::Stack<Kernel::Literal_*>::~Stack(&local_38);
  return;
}

Assistant:

void EqualityProxy::addLocalAxioms(UnitList*& units)
{
  // reflexivity
  Stack<Literal*> lits;
  TermList sort = TermList(false, 0);

  lits.push(makeProxyLiteral(true,TermList(1,false),TermList(1,false), sort));
  UnitList::push(createEqProxyAxiom(lits),units);

  // symmetry
  if (_opt == Options::EqualityProxy::RS || _opt == Options::EqualityProxy::RST || _opt == Options::EqualityProxy::RSTC) {
    lits.reset();
    lits.push(makeProxyLiteral(false,TermList(1,false),TermList(2,false), sort));
    lits.push(makeProxyLiteral(true,TermList(2,false),TermList(1,false), sort));
    UnitList::push(createEqProxyAxiom(lits),units);
  }
  // transitivity
  if (_opt == Options::EqualityProxy::RST || _opt == Options::EqualityProxy::RSTC) {
    lits.reset();
    lits.push(makeProxyLiteral(false,TermList(1,false),TermList(2,false), sort));
    lits.push(makeProxyLiteral(false,TermList(2,false),TermList(3,false), sort));
    lits.push(makeProxyLiteral(true,TermList(1,false),TermList(3,false), sort));
    UnitList::push(createEqProxyAxiom(lits),units);
  }
}